

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O3

ScalarFunction * duckdb::EnumRangeBoundaryFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_d1;
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  code *local_b8;
  LogicalType local_b0 [24];
  LogicalType local_98 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType(local_50,ANY);
  duckdb::LogicalType::LogicalType(local_38,ANY);
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_d1);
  duckdb::LogicalType::LogicalType(local_b0,VARCHAR);
  duckdb::LogicalType::LIST(local_98);
  local_c8 = 0;
  local_d0 = EnumRangeBoundaryFunction;
  local_b8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_68,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_68);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,3);
  }
  duckdb::LogicalType::~LogicalType(local_98);
  duckdb::LogicalType::~LogicalType(local_b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_50 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction EnumRangeBoundaryFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY, LogicalType::ANY}, LogicalType::LIST(LogicalType::VARCHAR),
	                          EnumRangeBoundaryFunction, BindEnumRangeBoundaryFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}